

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  size_t i_2;
  bool bVar7;
  sysbvm_tuple_t local_1c8;
  sysbvm_tuple_t sStack_1c0;
  sysbvm_tuple_t local_1b8;
  sysbvm_context_t *psStack_1b0;
  sysbvm_tuple_t local_1a8;
  sysbvm_tuple_t sStack_1a0;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t sStack_190;
  sysbvm_tuple_t local_188;
  sysbvm_tuple_t sStack_180;
  sysbvm_tuple_t local_178;
  sysbvm_tuple_t sStack_170;
  sysbvm_tuple_t local_168;
  sysbvm_tuple_t sStack_160;
  sysbvm_tuple_t local_158;
  sysbvm_tuple_t sStack_150;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  undefined1 *local_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *local_f0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_158 = 0;
  sStack_150 = 0;
  local_168 = 0;
  sStack_160 = 0;
  local_178 = 0;
  sStack_170 = 0;
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  sStack_190 = 0;
  local_1a8 = 0;
  sStack_1a0 = 0;
  local_1b8 = 0;
  psStack_1b0 = (sysbvm_context_t *)0x0;
  local_1c8 = 0;
  sStack_1c0 = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 0x10;
  local_110 = (undefined1 *)&local_1c8;
  sysbvm_stackFrame_pushRecord(&local_128);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar4 = *(sysbvm_tuple_t *)(*arguments + 0x28);
  if (sVar4 == 0) {
    local_1b8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
    sVar3 = arguments[1];
    _Var2 = sysbvm_environment_lookSymbolRecursively(context,sVar3,local_1b8,&local_1a8);
    if ((!_Var2) ||
       (sVar3 = local_1a8, _Var2 = sysbvm_symbolBinding_isValue(context,local_1a8), !_Var2)) {
      sysbvm_error("Failed to find symbol for message send without receiver.");
    }
    psStack_1b0 = (sysbvm_context_t *)sysbvm_symbolValueBinding_getValue(local_1a8);
  }
  else {
    local_1c8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sVar4,arguments[1]);
    if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
      sStack_1c0 = sysbvm_tuple_getType(context,local_1c8);
    }
    else {
      sStack_1c0 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                             (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    }
    sVar3 = sysbvm_tuple_getType(context,sStack_1c0);
    sStack_1a0 = sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction
                           (context,sVar3);
    if (sStack_1a0 != 0) {
      sStack_150 = sysbvm_function_apply4
                             (context,sStack_1a0,sStack_1c0,*arguments,local_1c8,arguments[1]);
      goto LAB_00123aca;
    }
    local_1b8 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
    sVar3 = sStack_1c0;
    psStack_1b0 = (sysbvm_context_t *)sysbvm_type_lookupMacroSelector(context,sStack_1c0,local_1b8);
    if (((psStack_1b0 == (sysbvm_context_t *)0x0) &&
        (sVar3 = sStack_1c0,
        psStack_1b0 = (sysbvm_context_t *)sysbvm_type_lookupSelector(context,sStack_1c0,local_1b8),
        psStack_1b0 == (sysbvm_context_t *)0x0)) &&
       (sVar3 = sStack_1c0,
       psStack_1b0 = (sysbvm_context_t *)
                     sysbvm_type_lookupFallbackSelector(context,sStack_1c0,local_1b8),
       psStack_1b0 == (sysbvm_context_t *)0x0)) {
      uVar5 = *(ulong *)(*arguments + 0x40);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        sVar4 = (sysbvm_tuple_t)(*(uint *)(uVar5 + 0xc) >> 3);
      }
      else {
        sVar4 = 0;
      }
      sVar3 = sStack_1c0;
      psStack_1b0 = (sysbvm_context_t *)
                    sysbvm_type_lookupMacroSelector
                              (context,sStack_1c0,(context->roots).doesNotUnderstandSelector);
      if (((psStack_1b0 == (sysbvm_context_t *)0x0) &&
          (sVar3 = sStack_1c0,
          psStack_1b0 = (sysbvm_context_t *)
                        sysbvm_type_lookupSelector
                                  (context,sStack_1c0,(context->roots).doesNotUnderstandSelector),
          psStack_1b0 == (sysbvm_context_t *)0x0)) &&
         (sVar3 = sStack_1c0,
         psStack_1b0 = (sysbvm_context_t *)
                       sysbvm_type_lookupFallbackSelector
                                 (context,sStack_1c0,(context->roots).doesNotUnderstandSelector),
         psStack_1b0 == (sysbvm_context_t *)0x0)) {
        sysbvm_error("Message not understood.");
      }
      _Var2 = sysbvm_function_isMacro(psStack_1b0,sVar3);
      if (!_Var2) {
        sStack_170 = sysbvm_array_create(context,sVar4);
        for (sVar3 = 0; sVar4 != sVar3; sVar3 = sVar3 + 1) {
          uVar5 = *(ulong *)(*arguments + 0x40);
          if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
            local_168 = *(sysbvm_tuple_t *)(uVar5 + 0x10 + sVar3 * 8);
          }
          else {
            local_168 = 0;
          }
          sStack_160 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                                 (context,local_168,arguments[1]);
          if ((sStack_160 & 0xf) == 0 && sStack_160 != 0) {
            *(sysbvm_tuple_t *)(sStack_160 + 0x10 + sVar3 * 8) = sStack_160;
          }
        }
        local_158 = sysbvm_message_create
                              (context,local_1b8,sStack_170,sStack_1c0,
                               *(sysbvm_tuple_t *)(*arguments + 0x10));
        sStack_150 = sysbvm_function_applyNoCheck2
                               (context,(sysbvm_tuple_t)psStack_1b0,local_1c8,local_158);
        goto LAB_00123aca;
      }
      local_198 = sysbvm_macroContext_create
                            (context,*arguments,*(sysbvm_tuple_t *)(*arguments + 0x10),arguments[1])
      ;
      local_178 = sysbvm_context_shallowCopy(context,*arguments);
      uVar5 = *(ulong *)(*arguments + 0x28);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar5 + 0x10);
      }
      else {
        sVar4 = 0;
      }
      local_188 = sysbvm_astLiteralNode_create(context,sVar4,local_1c8);
      *(sysbvm_tuple_t *)(local_178 + 0x28) = local_188;
      uVar5 = *(ulong *)(*arguments + 0x38);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar5 + 0x10);
      }
      else {
        sVar4 = 0;
      }
      sStack_180 = sysbvm_astLiteralNode_create(context,sVar4,local_1b8);
      *(sysbvm_tuple_t *)(local_178 + 0x38) = sStack_180;
      sStack_190 = sysbvm_function_apply3
                             (context,(sysbvm_tuple_t)psStack_1b0,local_198,local_188,local_178);
      goto LAB_00123b6f;
    }
  }
  _Var2 = sysbvm_function_isMacro(psStack_1b0,sVar3);
  memset(&callFrameStack,0,0xb0);
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 0x11;
  local_f0 = &callFrameStack.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_108);
  uVar5 = *(ulong *)(*arguments + 0x40);
  bVar7 = (uVar5 & 0xf) != 0;
  if (_Var2) {
    if (bVar7 || uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
    }
    sysbvm_functionCallFrameStack_begin
              (context,&callFrameStack,(sysbvm_tuple_t)psStack_1b0,(ulong)(sVar4 != 0) + 1 + uVar5,0
              );
    local_198 = sysbvm_macroContext_create
                          (context,*arguments,*(sysbvm_tuple_t *)(*arguments + 0x10),arguments[1]);
    sysbvm_functionCallFrameStack_push(&callFrameStack,local_198);
    if (sVar4 != 0) {
      uVar6 = *(ulong *)(*arguments + 0x28);
      if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar6 + 0x10);
      }
      else {
        sVar4 = 0;
      }
      local_188 = sysbvm_astLiteralNode_create(context,sVar4,local_1c8);
      sysbvm_functionCallFrameStack_push(&callFrameStack,local_188);
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = *(ulong *)(*arguments + 0x40);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8);
      }
      else {
        sVar4 = 0;
      }
      sysbvm_functionCallFrameStack_push(&callFrameStack,sVar4);
    }
    sysbvm_stackFrame_popRecord(&local_108);
    sStack_190 = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
LAB_00123b6f:
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_128);
    sVar4 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,sStack_190,arguments[1])
    ;
    return sVar4;
  }
  if (bVar7 || uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  sysbvm_functionCallFrameStack_begin
            (context,&callFrameStack,(sysbvm_tuple_t)psStack_1b0,(sVar4 != 0) + uVar5,0);
  if (sVar4 != 0) {
    sysbvm_functionCallFrameStack_push(&callFrameStack,local_1c8);
  }
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x40);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_168 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8);
    }
    else {
      local_168 = 0;
    }
    sStack_160 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                           (context,local_168,arguments[1]);
    sysbvm_functionCallFrameStack_push(&callFrameStack,sStack_160);
  }
  sysbvm_stackFrame_popRecord(&local_108);
  sStack_150 = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
LAB_00123aca:
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_128);
  return sStack_150;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;

    struct {
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodBinding;

        sysbvm_tuple_t analysisAndEvaluationFunction;
        sysbvm_tuple_t macroContext;
        sysbvm_tuple_t expansionResult;
        sysbvm_tuple_t receiverLiteralNode;
        sysbvm_tuple_t selectorLiteralNode;
        sysbvm_astMessageSendNode_t *messageNode;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t message;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sendNode)->super.sourcePosition);

    bool hasReceiver = false;
    if((*sendNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiver, *environment);
        hasReceiver = true;

        if((*sendNode)->receiverLookupType)
            gcFrame.receiverType = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->receiverLookupType, *environment);
        else
            gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.analysisAndEvaluationFunction = sysbvm_type_getAnalyzeAndEvaluateMessageSendNodeForReceiverWithEnvironmentFunction(context, sysbvm_tuple_getType(context, gcFrame.receiverType));
        if(gcFrame.analysisAndEvaluationFunction)
        {
            gcFrame.result = sysbvm_function_apply4(context, gcFrame.analysisAndEvaluationFunction, gcFrame.receiverType, *node, gcFrame.receiver, *environment);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }

        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
            gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
            gcFrame.method = sysbvm_type_lookupMacroSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                gcFrame.method = sysbvm_type_lookupFallbackSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            // Does not understand: 
            if(sysbvm_function_isMacro(context, gcFrame.method))
            {
                gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
                gcFrame.messageNode = (sysbvm_astMessageSendNode_t *)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*sendNode);

                gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
                gcFrame.messageNode->receiver = gcFrame.receiverLiteralNode;

                gcFrame.selectorLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->selector), gcFrame.selector);
                gcFrame.messageNode->selector = gcFrame.selectorLiteralNode;

                gcFrame.expansionResult = sysbvm_function_apply3(context, gcFrame.method, gcFrame.macroContext, gcFrame.receiverLiteralNode, (sysbvm_tuple_t)gcFrame.messageNode);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

                // Analyze and evaluate the resulting node.
                return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
            }
            else
            {
                gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
                for(size_t i = 0; i < applicationArgumentCount; ++i)
                {
                    gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
                    gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                    sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
                }

                gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, (*sendNode)->super.sourcePosition);
                gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.method, gcFrame.receiver, gcFrame.message);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return gcFrame.result;
            }
        }
    }
    else
    {
        gcFrame.selector = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }

    bool isMacro = sysbvm_function_isMacro(context, gcFrame.method);
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    if(isMacro)
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, 1 + applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*sendNode)->super.sourcePosition, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.macroContext);

        // We need to push the receiver as a node, so wrap it in a literal node here.
        if(hasReceiver)
        {
            gcFrame.receiverLiteralNode = sysbvm_astLiteralNode_create(context, sysbvm_astNode_getSourcePosition((*sendNode)->receiver), gcFrame.receiver);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiverLiteralNode);
        }

        // Push the argument nodes.
        for(size_t i = 0; i < applicationArgumentCount; ++i)
            sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at((*sendNode)->arguments, i));

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.expansionResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

        // Analyze and evaluate the resulting node.
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expansionResult, *environment);
    }
    else
    {
        size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
        sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

        if(hasReceiver)
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiver);

        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
            gcFrame.argument = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
            sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
        }

        SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
        gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
}